

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelDepthCase::checkTextureState
          (TextureLevelDepthCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  bool bVar1;
  pointer pTVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  if ((spec->levels).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (spec->levels).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pTVar2 = (spec->levels).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar3 = true;
    if (0 < (int)((ulong)((long)(spec->levels).
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) >> 3) *
            -0x55555555) {
      lVar4 = 0xc;
      lVar5 = 0;
      do {
        bVar1 = verifyTextureLevelParameterEqual
                          (gl,spec->queryTarget,*(int *)((long)&pTVar2->width + lVar4),0x8071,
                           *(int *)((long)pTVar2 + lVar4 + -4),
                           (this->super_TextureLevelCommonCase).super_TextureLevelCase.m_type);
        bVar3 = (bool)(bVar3 & bVar1);
        lVar5 = lVar5 + 1;
        pTVar2 = (spec->levels).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = lVar4 + 0x18;
      } while (lVar5 < (int)((ulong)((long)(spec->levels).
                                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2
                                    ) >> 3) * -0x55555555);
    }
    return bVar3;
  }
  bVar3 = verifyTextureLevelParameterEqual
                    (gl,spec->queryTarget,0,0x8071,0,
                     (this->super_TextureLevelCommonCase).super_TextureLevelCase.m_type);
  return bVar3;
}

Assistant:

bool checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
	{
		const int	initialValue	= 0;
		bool		allOk			= true;

		if (spec.levels.empty())
		{
			const int queryLevel	= 0;
			const int refValue		= initialValue;

			allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, queryLevel, GL_TEXTURE_DEPTH, refValue, m_type);
		}
		else
		{
			for (int levelNdx = 0; levelNdx < (int)spec.levels.size(); ++levelNdx)
			{
				const int queryLevel	= spec.levels[levelNdx].level;
				const int refValue		= spec.levels[levelNdx].depth;

				allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, queryLevel, GL_TEXTURE_DEPTH, refValue, m_type);
			}
		}

		return allOk;
	}